

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# remote_server.cpp
# Opt level: O0

void connect_and_get_status(int ServerPort)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined8 uVar3;
  long lVar4;
  int in_EDI;
  CMConnection conn;
  atom_t CM_IP_HOSTNAME;
  atom_t CM_IP_PORT;
  attr_list contact_list;
  Remote_evpath_state ev_state;
  _StatusServerMsg status_msg;
  CManager cm;
  undefined8 local_28;
  undefined4 local_14;
  undefined8 local_10;
  int local_4;
  
  local_4 = in_EDI;
  local_10 = CManager_create();
  uVar3 = create_attr_list();
  uVar1 = attr_atom_from_string("IP_HOST");
  uVar2 = attr_atom_from_string("IP_PORT");
  add_attr(uVar3,uVar1,3,hostname);
  add_attr(uVar3,uVar2,1,(long)local_4);
  lVar4 = CMinitiate_conn(local_10);
  uVar3 = local_10;
  if (lVar4 == 0) {
    return;
  }
  adios2::EVPathRemoteCommon::RegisterFormats((Remote_evpath_state *)0x1187a6);
  ServerRegisterHandlers((Remote_evpath_state *)0x1187b0);
  memset(&local_14,0,4);
  local_14 = CMCondition_get(uVar3,lVar4);
  CMwrite(lVar4,local_28,&local_14);
  CMCondition_wait(uVar3,local_14);
  exit(0);
}

Assistant:

void connect_and_get_status(int ServerPort)
{
    CManager cm = CManager_create();
    _StatusServerMsg status_msg;
    struct Remote_evpath_state ev_state;
    attr_list contact_list = create_attr_list();
    atom_t CM_IP_PORT = -1;
    atom_t CM_IP_HOSTNAME = -1;
    CM_IP_HOSTNAME = attr_atom_from_string("IP_HOST");
    CM_IP_PORT = attr_atom_from_string("IP_PORT");
    add_attr(contact_list, CM_IP_HOSTNAME, Attr_String, (attr_value)hostname);
    add_attr(contact_list, CM_IP_PORT, Attr_Int4, (attr_value)ServerPort);
    CMConnection conn = CMinitiate_conn(cm, contact_list);
    if (!conn)
        return;

    ev_state.cm = cm;

    RegisterFormats(ev_state);

    ServerRegisterHandlers(ev_state);

    memset(&status_msg, 0, sizeof(status_msg));
    status_msg.StatusResponseCondition = CMCondition_get(ev_state.cm, conn);
    CMwrite(conn, ev_state.StatusServerFormat, &status_msg);
    CMCondition_wait(ev_state.cm, status_msg.StatusResponseCondition);
    exit(0);
}